

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int write_sparse_skip_chunk(output_file *out,int64_t skip_len)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  int ret;
  chunk_header_t chunk_header;
  undefined2 local_24;
  undefined2 local_22;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  long *local_10;
  int local_4;
  
  if (in_RSI % (long)(ulong)*(uint *)((long)in_RDI + 0x24) == 0) {
    local_24 = 0xcac3;
    local_22 = 0;
    local_20 = (undefined4)(in_RSI / (long)(ulong)*(uint *)((long)in_RDI + 0x24));
    local_1c = 0xc;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = (**(code **)(in_RDI[2] + 0x18))(in_RDI,&local_24,0xc);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      *local_10 = local_18 + *local_10;
      *(int *)(local_10 + 1) = (int)local_10[1] + 1;
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,"error: %s: don\'t care size %li is not a multiple of the block size %u\n",
            "write_sparse_skip_chunk",in_RSI,(ulong)*(uint *)((long)in_RDI + 0x24));
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int write_sparse_skip_chunk(struct output_file* out, int64_t skip_len) {
  chunk_header_t chunk_header;
  int ret;

  if (skip_len % out->block_size) {
    error("don't care size %" PRIi64 " is not a multiple of the block size %u", skip_len,
          out->block_size);
    return -1;
  }

  /* We are skipping data, so emit a don't care chunk. */
  chunk_header.chunk_type = CHUNK_TYPE_DONT_CARE;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = skip_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN;
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));
  if (ret < 0) return -1;

  out->cur_out_ptr += skip_len;
  out->chunk_cnt++;

  return 0;
}